

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O1

void j2k_dump(opj_j2k_t *p_j2k,OPJ_INT32 flag,FILE *out_stream)

{
  opj_codestream_index_t *poVar1;
  opj_marker_info_t *poVar2;
  opj_tp_index_t *poVar3;
  opj_tile_index_t *poVar4;
  size_t __size;
  char *__ptr;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  opj_tcp_t *l_default_tile;
  long lVar9;
  
  if ((flag & 0x180U) == 0) {
    if (((flag & 1U) != 0) && (p_j2k->m_private_image != (opj_image_t *)0x0)) {
      j2k_dump_image_header(p_j2k->m_private_image,0,out_stream);
    }
    if (((flag & 2U) != 0) && (p_j2k->m_private_image != (opj_image_t *)0x0)) {
      fwrite("Codestream info from main header: {\n",0x24,1,(FILE *)out_stream);
      fprintf((FILE *)out_stream,"\t tx0=%d, ty0=%d\n",(ulong)(p_j2k->m_cp).tx0,
              (ulong)(p_j2k->m_cp).ty0);
      fprintf((FILE *)out_stream,"\t tdx=%d, tdy=%d\n",(ulong)(p_j2k->m_cp).tdx,
              (ulong)(p_j2k->m_cp).tdy);
      fprintf((FILE *)out_stream,"\t tw=%d, th=%d\n",(ulong)(p_j2k->m_cp).tw,(ulong)(p_j2k->m_cp).th
             );
      opj_j2k_dump_tile_info
                ((p_j2k->m_specific_param).m_decoder.m_default_tcp,p_j2k->m_private_image->numcomps,
                 out_stream);
      fwrite("}\n",2,1,(FILE *)out_stream);
    }
    if (((flag & 8U) != 0) &&
       (iVar5 = (p_j2k->m_cp).tw * (p_j2k->m_cp).th,
       iVar5 != 0 && p_j2k->m_private_image != (opj_image_t *)0x0)) {
      l_default_tile = (p_j2k->m_cp).tcps;
      do {
        opj_j2k_dump_tile_info(l_default_tile,p_j2k->m_private_image->numcomps,out_stream);
        l_default_tile = l_default_tile + 1;
        iVar5 = iVar5 + -1;
      } while (iVar5 != 0);
    }
    if ((flag & 0x10U) == 0) {
      return;
    }
    poVar1 = p_j2k->cstr_index;
    fwrite("Codestream index from main header: {\n",0x25,1,(FILE *)out_stream);
    fprintf((FILE *)out_stream,
            "\t Main header start position=%li\n\t Main header end position=%li\n",
            poVar1->main_head_start,poVar1->main_head_end);
    fwrite("\t Marker list: {\n",0x11,1,(FILE *)out_stream);
    if ((poVar1->marker != (opj_marker_info_t *)0x0) && (poVar1->marknum != 0)) {
      lVar9 = 0x10;
      uVar6 = 0;
      do {
        poVar2 = poVar1->marker;
        fprintf((FILE *)out_stream,"\t\t type=%#x, pos=%li, len=%d\n",
                (ulong)*(ushort *)((long)poVar2 + lVar9 + -0x10),
                *(undefined8 *)((long)poVar2 + lVar9 + -8),
                (ulong)*(uint *)((long)&poVar2->type + lVar9));
        uVar6 = uVar6 + 1;
        lVar9 = lVar9 + 0x18;
      } while (uVar6 < poVar1->marknum);
    }
    fwrite("\t }\n",4,1,(FILE *)out_stream);
    if ((poVar1->tile_index != (opj_tile_index_t *)0x0) && ((ulong)poVar1->nb_of_tiles != 0)) {
      lVar9 = 0;
      iVar5 = 0;
      do {
        iVar5 = iVar5 + *(int *)((long)&poVar1->tile_index->nb_tps + lVar9);
        lVar9 = lVar9 + 0x38;
      } while ((ulong)poVar1->nb_of_tiles * 0x38 - lVar9 != 0);
      if (iVar5 != 0) {
        fwrite("\t Tile index: {\n",0x10,1,(FILE *)out_stream);
        if (poVar1->nb_of_tiles != 0) {
          uVar6 = 0;
          do {
            uVar7 = (ulong)poVar1->tile_index[uVar6].nb_tps;
            fprintf((FILE *)out_stream,"\t\t nb of tile-part in tile [%d]=%d\n",uVar6,uVar7);
            if ((uVar7 != 0) && (poVar1->tile_index[uVar6].tp_index != (opj_tp_index_t *)0x0)) {
              lVar9 = 0x10;
              uVar8 = 0;
              do {
                poVar3 = poVar1->tile_index[uVar6].tp_index;
                fprintf((FILE *)out_stream,
                        "\t\t\t tile-part[%d]: star_pos=%li, end_header=%li, end_pos=%li.\n",
                        uVar8 & 0xffffffff,*(undefined8 *)((long)poVar3 + lVar9 + -0x10),
                        *(undefined8 *)((long)poVar3 + lVar9 + -8),
                        *(undefined8 *)((long)&poVar3->start_pos + lVar9));
                uVar8 = uVar8 + 1;
                lVar9 = lVar9 + 0x18;
              } while (uVar7 != uVar8);
            }
            poVar4 = poVar1->tile_index;
            if ((poVar4[uVar6].marker != (opj_marker_info_t *)0x0) && (poVar4[uVar6].marknum != 0))
            {
              lVar9 = 0x10;
              uVar7 = 0;
              do {
                poVar2 = poVar4[uVar6].marker;
                fprintf((FILE *)out_stream,"\t\t type=%#x, pos=%li, len=%d\n",
                        (ulong)*(ushort *)((long)poVar2 + lVar9 + -0x10),
                        *(undefined8 *)((long)poVar2 + lVar9 + -8),
                        (ulong)*(uint *)((long)&poVar2->type + lVar9));
                uVar7 = uVar7 + 1;
                poVar4 = poVar1->tile_index;
                lVar9 = lVar9 + 0x18;
              } while (uVar7 < poVar4[uVar6].marknum);
            }
            uVar6 = uVar6 + 1;
          } while (uVar6 < poVar1->nb_of_tiles);
        }
        fwrite("\t }\n",4,1,(FILE *)out_stream);
      }
    }
    __ptr = "}\n";
    __size = 2;
  }
  else {
    __ptr = "Wrong flag\n";
    __size = 0xb;
  }
  fwrite(__ptr,__size,1,(FILE *)out_stream);
  return;
}

Assistant:

void j2k_dump(opj_j2k_t* p_j2k, OPJ_INT32 flag, FILE* out_stream)
{
    /* Check if the flag is compatible with j2k file*/
    if ((flag & OPJ_JP2_INFO) || (flag & OPJ_JP2_IND)) {
        fprintf(out_stream, "Wrong flag\n");
        return;
    }

    /* Dump the image_header */
    if (flag & OPJ_IMG_INFO) {
        if (p_j2k->m_private_image) {
            j2k_dump_image_header(p_j2k->m_private_image, 0, out_stream);
        }
    }

    /* Dump the codestream info from main header */
    if (flag & OPJ_J2K_MH_INFO) {
        if (p_j2k->m_private_image) {
            opj_j2k_dump_MH_info(p_j2k, out_stream);
        }
    }
    /* Dump all tile/codestream info */
    if (flag & OPJ_J2K_TCH_INFO) {
        OPJ_UINT32 l_nb_tiles = p_j2k->m_cp.th * p_j2k->m_cp.tw;
        OPJ_UINT32 i;
        opj_tcp_t * l_tcp = p_j2k->m_cp.tcps;
        if (p_j2k->m_private_image) {
            for (i = 0; i < l_nb_tiles; ++i) {
                opj_j2k_dump_tile_info(l_tcp, (OPJ_INT32)p_j2k->m_private_image->numcomps,
                                       out_stream);
                ++l_tcp;
            }
        }
    }

    /* Dump the codestream info of the current tile */
    if (flag & OPJ_J2K_TH_INFO) {

    }

    /* Dump the codestream index from main header */
    if (flag & OPJ_J2K_MH_IND) {
        opj_j2k_dump_MH_index(p_j2k, out_stream);
    }

    /* Dump the codestream index of the current tile */
    if (flag & OPJ_J2K_TH_IND) {

    }

}